

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDDD::NodeIntStateIncrement(ChNodeFEAxyzDDD *this)

{
  ChState *in_RCX;
  ChState *in_RDX;
  uint in_ESI;
  uint in_R8D;
  ChStateDelta *in_R9;
  
  NodeIntStateIncrement(this,in_ESI,in_RDX,in_RCX,in_R8D,in_R9);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateIncrement(const unsigned int off_x,
                                           ChState& x_new,
                                           const ChState& x,
                                           const unsigned int off_v,
                                           const ChStateDelta& Dv) {
    x_new(off_x + 0) = x(off_x + 0) + Dv(off_v + 0);
    x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
    x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);
    x_new(off_x + 3) = x(off_x + 3) + Dv(off_v + 3);
    x_new(off_x + 4) = x(off_x + 4) + Dv(off_v + 4);
    x_new(off_x + 5) = x(off_x + 5) + Dv(off_v + 5);
    x_new(off_x + 6) = x(off_x + 6) + Dv(off_v + 6);
    x_new(off_x + 7) = x(off_x + 7) + Dv(off_v + 7);
    x_new(off_x + 8) = x(off_x + 8) + Dv(off_v + 8);
	x_new(off_x + 9) = x(off_x + 9) + Dv(off_v + 9);
	x_new(off_x + 10) = x(off_x + 10) + Dv(off_v + 10);
	x_new(off_x + 11) = x(off_x + 11) + Dv(off_v + 11);
}